

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.h
# Opt level: O2

void __thiscall cmWorkerPool::ProcessResultT::~ProcessResultT(ProcessResultT *this)

{
  std::__cxx11::string::~string((string *)&this->ErrorMessage);
  std::__cxx11::string::~string((string *)&this->StdErr);
  std::__cxx11::string::~string((string *)&this->StdOut);
  return;
}

Assistant:

bool error() const
    {
      return (ExitStatus != 0) || (TermSignal != 0) || !ErrorMessage.empty();
    }